

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schriter.cpp
# Opt level: O3

void __thiscall
icu_63::StringCharacterIterator::StringCharacterIterator
          (StringCharacterIterator *this,UnicodeString *textStr,int32_t textPos)

{
  ushort uVar1;
  char16_t *pcVar2;
  int32_t length;
  ConstChar16Ptr local_28;
  char16_t *local_20;
  
  uVar1 = (textStr->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) == 0) {
    if ((uVar1 & 2) == 0) {
      local_28.p_ = (textStr->fUnion).fFields.fArray;
    }
    else {
      local_28.p_ = (char16_t *)((long)&textStr->fUnion + 2);
    }
  }
  else {
    local_28.p_ = (char16_t *)0x0;
  }
  if ((short)uVar1 < 0) {
    length = (textStr->fUnion).fFields.fLength;
  }
  else {
    length = (int)(short)uVar1 >> 5;
  }
  UCharCharacterIterator::UCharCharacterIterator
            (&this->super_UCharCharacterIterator,&local_28,length,textPos);
  local_20 = local_28.p_;
  (this->super_UCharCharacterIterator).super_CharacterIterator.super_ForwardCharacterIterator.
  super_UObject._vptr_UObject = (_func_int **)&PTR__StringCharacterIterator_003dba70;
  UnicodeString::UnicodeString(&this->text,textStr);
  uVar1 = (this->text).fUnion.fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) == 0) {
    if ((uVar1 & 2) == 0) {
      pcVar2 = (this->text).fUnion.fFields.fArray;
    }
    else {
      pcVar2 = (char16_t *)((long)&(this->text).fUnion + 2);
    }
  }
  else {
    pcVar2 = (char16_t *)0x0;
  }
  (this->super_UCharCharacterIterator).text = pcVar2;
  return;
}

Assistant:

StringCharacterIterator::StringCharacterIterator(const UnicodeString& textStr,
                                                 int32_t textPos)
  : UCharCharacterIterator(textStr.getBuffer(), textStr.length(), textPos),
    text(textStr)
{
    // we had set the input parameter's array, now we need to set our copy's array
    UCharCharacterIterator::text = this->text.getBuffer();
}